

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O3

DdNode * extraBddCheckVarsSymmetric(DdManager *dd,DdNode *bF,DdNode *bVars)

{
  int iVar1;
  int iVar2;
  DdNode *data;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  int iVar6;
  int *piVar7;
  
  data = dd->one;
  if ((DdNode *)((ulong)data ^ 1) != bF) {
    if (data == bVars) {
      __assert_fail("bVars != b1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddSymm.c"
                    ,0x49b,"DdNode *extraBddCheckVarsSymmetric(DdManager *, DdNode *, DdNode *)");
    }
    data = cuddCacheLookup2(dd,extraBddCheckVarsSymmetric,bF,bVars);
    if (data == (DdNode *)0x0) {
      pDVar4 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
      iVar2 = 0x7fffffff;
      if ((ulong)pDVar4->index != 0x7fffffff) {
        iVar2 = dd->perm[pDVar4->index];
      }
      pDVar3 = (DdNode *)((ulong)bVars & 0xfffffffffffffffe);
      data = dd->one;
      if (pDVar3 == bVars) {
        pDVar5 = (bVars->type).kids.T;
        if (pDVar5 == data) {
          piVar7 = dd->perm;
          iVar6 = -1;
          pDVar5 = bVars;
        }
        else {
          if ((pDVar5->type).kids.T != data) {
            __assert_fail("cuddT(cuddT(bVars)) == b1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddSymm.c"
                          ,0x4bc,
                          "DdNode *extraBddCheckVarsSymmetric(DdManager *, DdNode *, DdNode *)");
          }
          piVar7 = dd->perm;
          iVar6 = piVar7[bVars->index];
        }
      }
      else {
        if ((pDVar3->type).kids.T != data) {
          __assert_fail("cuddT(bVarsR) == b1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddSymm.c"
                        ,0x4ad,"DdNode *extraBddCheckVarsSymmetric(DdManager *, DdNode *, DdNode *)"
                       );
        }
        piVar7 = dd->perm;
        iVar6 = -1;
        pDVar5 = pDVar3;
      }
      iVar1 = piVar7[pDVar5->index];
      if (iVar2 < iVar1) {
        pDVar5 = (pDVar4->type).kids.E;
        if (pDVar4 == bF) {
          pDVar4 = (pDVar4->type).kids.T;
        }
        else {
          pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
          pDVar4 = (DdNode *)((ulong)(pDVar4->type).kids.T ^ 1);
        }
      }
      else {
        pDVar5 = (DdNode *)0x0;
        pDVar4 = (DdNode *)0x0;
      }
      if (iVar2 < iVar6) {
        pDVar5 = extraBddCheckVarsSymmetric(dd,pDVar5,bVars);
        pDVar3 = dd->zero;
        if (pDVar5 == pDVar3) {
          __assert_fail("bRes0 != z0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddSymm.c"
                        ,0x4e3,"DdNode *extraBddCheckVarsSymmetric(DdManager *, DdNode *, DdNode *)"
                       );
        }
        data = (DdNode *)((ulong)dd->one ^ 1);
        if (pDVar5 != data) {
          data = extraBddCheckVarsSymmetric(dd,pDVar4,bVars);
          pDVar3 = dd->zero;
        }
        if (data == pDVar3) {
          __assert_fail("bRes != z0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddSymm.c"
                        ,0x4e9,"DdNode *extraBddCheckVarsSymmetric(DdManager *, DdNode *, DdNode *)"
                       );
        }
      }
      else if (iVar2 == iVar6) {
        pDVar3 = extraBddCheckVarsSymmetric(dd,pDVar5,(DdNode *)((ulong)(bVars->type).kids.T ^ 1));
        data = (DdNode *)((ulong)dd->one ^ 1);
        if (pDVar3 != data) {
          pDVar5 = extraBddCheckVarsSymmetric(dd,pDVar4,(DdNode *)((ulong)(bVars->type).kids.T ^ 1))
          ;
          pDVar4 = dd->one;
          data = (DdNode *)((ulong)pDVar4 ^ 1);
          if (pDVar5 != data) {
            if (pDVar5 == dd->zero) {
              data = pDVar4;
            }
            if (pDVar3 == dd->zero) {
              data = pDVar4;
            }
          }
        }
      }
      else if (iVar2 < iVar1) {
        pDVar3 = extraBddCheckVarsSymmetric(dd,pDVar5,bVars);
        data = (DdNode *)((ulong)dd->one ^ 1);
        if (pDVar3 != data) {
          pDVar4 = extraBddCheckVarsSymmetric(dd,pDVar4,bVars);
          data = (DdNode *)((ulong)dd->one ^ 1);
          if (pDVar4 != data) {
            pDVar5 = dd->zero;
            data = dd->one;
            if (pDVar4 == pDVar5) {
              data = pDVar5;
            }
            if (pDVar3 == pDVar5) {
              data = pDVar5;
            }
          }
        }
      }
      else if (iVar2 == iVar1) {
        if (pDVar3 == bVars) {
          data = (DdNode *)((ulong)data ^ 1);
        }
        else {
          data = dd->zero;
        }
      }
      cuddCacheInsert2(dd,extraBddCheckVarsSymmetric,bF,bVars,data);
    }
  }
  return data;
}

Assistant:

DdNode * extraBddCheckVarsSymmetric( 
  DdManager * dd,    /* the DD manager */
  DdNode * bF,
  DdNode * bVars) 
{
    DdNode * bRes;

    if ( bF == b0 )
        return b1;

    assert( bVars != b1 );
    
    if ( (bRes = cuddCacheLookup2(dd, extraBddCheckVarsSymmetric, bF, bVars)) )
        return bRes;
    else
    {
        DdNode * bRes0, * bRes1;
        DdNode * bF0, * bF1;             
        DdNode * bFR = Cudd_Regular(bF);
        int LevelF = cuddI(dd,bFR->index);

        DdNode * bVarsR = Cudd_Regular(bVars);
        int fVar1Pres;
        int iLev1;
        int iLev2;

        if ( bVarsR != bVars ) // cube's pointer is complemented
        {
            assert( cuddT(bVarsR) == b1 );
            fVar1Pres = 1;                    // the first var is present on the path
            iLev1 = -1;                       // we are already below the first var level
            iLev2 = dd->perm[bVarsR->index];  // the level of the second var
        }
        else  // cube's pointer is NOT complemented
        {
            fVar1Pres = 0;                    // the first var is absent on the path
            if ( cuddT(bVars) == b1 )
            {
                iLev1 = -1;                             // we are already below the first var level 
                iLev2 = dd->perm[bVars->index];         // the level of the second var
            }
            else
            {
                assert( cuddT(cuddT(bVars)) == b1 );
                iLev1 = dd->perm[bVars->index];         // the level of the first var 
                iLev2 = dd->perm[cuddT(bVars)->index];  // the level of the second var
            }
        }

        // cofactor the function
        // the cofactors are needed only if we are above the second level
        if ( LevelF < iLev2 )
        {
            if ( bFR != bF ) // bFunc is complemented 
            {
                bF0 = Cudd_Not( cuddE(bFR) );
                bF1 = Cudd_Not( cuddT(bFR) );
            }
            else
            {
                bF0 = cuddE(bFR);
                bF1 = cuddT(bFR);
            }
        }
        else
            bF0 = bF1 = NULL;

        // consider five cases:
        // (1) F is above iLev1
        // (2) F is on the level iLev1
        // (3) F is between iLev1 and iLev2
        // (4) F is on the level iLev2
        // (5) F is below iLev2

        // (1) F is above iLev1
        if ( LevelF < iLev1 )
        {
            // the returned result cannot have the hash attribute
            // because we still did not reach the level of Var1;
            // the attribute never travels above the level of Var1
            bRes0 = extraBddCheckVarsSymmetric( dd, bF0, bVars );
//          assert( !Hash_IsComplement( bRes0 ) );
            assert( bRes0 != z0 );
            if ( bRes0 == b0 )
                bRes = b0;
            else
                bRes = extraBddCheckVarsSymmetric( dd, bF1, bVars );
//          assert( !Hash_IsComplement( bRes ) );
            assert( bRes != z0 );
        }
        // (2) F is on the level iLev1
        else if ( LevelF == iLev1 )
        {
            bRes0 = extraBddCheckVarsSymmetric( dd, bF0, Cudd_Not( cuddT(bVars) ) );
            if ( bRes0 == b0 )
                bRes = b0;
            else
            {
                bRes1 = extraBddCheckVarsSymmetric( dd, bF1, Cudd_Not( cuddT(bVars) ) );
                if ( bRes1 == b0 )
                    bRes = b0;
                else
                {
//                  if ( Hash_IsComplement( bRes0 ) || Hash_IsComplement( bRes1 ) )
                    if ( bRes0 == z0 || bRes1 == z0 )
                        bRes = b1;
                    else
                        bRes = b0;
                }
            }
        }
        // (3) F is between iLev1 and iLev2
        else if ( LevelF < iLev2 )
        {
            bRes0 = extraBddCheckVarsSymmetric( dd, bF0, bVars );
            if ( bRes0 == b0 )
                bRes = b0;
            else
            {
                bRes1 = extraBddCheckVarsSymmetric( dd, bF1, bVars );
                if ( bRes1 == b0 )
                    bRes = b0;
                else
                {
//                  if ( Hash_IsComplement( bRes0 ) || Hash_IsComplement( bRes1 ) )
//                      bRes = Hash_Not( b1 );
                    if ( bRes0 == z0 || bRes1 == z0 )
                        bRes = z0;
                    else
                        bRes = b1;
                }
            }
        }
        // (4) F is on the level iLev2
        else if ( LevelF == iLev2 )
        {
            // this is the only place where the hash attribute (Hash_Not) can be added 
            // to the result; it can be added only if the path came through the node
            // lebeled with Var1; therefore, the hash attribute cannot be returned
            // to the caller function
            if ( fVar1Pres )
//              bRes = Hash_Not( b1 );
                bRes = z0;
            else 
                bRes = b0;
        }
        // (5) F is below iLev2
        else // if ( LevelF > iLev2 )
        {
            // it is possible that the path goes through the node labeled by Var1
            // and still everything is okay; we do not label with Hash_Not here
            // because the path does not go through node labeled by Var2
            bRes = b1;
        }

        cuddCacheInsert2(dd, extraBddCheckVarsSymmetric, bF, bVars, bRes);
        return bRes;
    }
}